

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.h
# Opt level: O2

ptrdiff_t mp_check_map(char *cur,char *end)

{
  byte bVar1;
  long lVar2;
  
  if (end <= cur) {
    __assert_fail("cur < end",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/msgpuck.h",
                  0x7e4,"ptrdiff_t mp_check_map(const char *, const char *)");
  }
  bVar1 = *cur;
  if (mp_type_hint[bVar1] == MP_MAP) {
    if ((bVar1 & 0xf0) == 0x80) {
      lVar2 = 1 - (long)end;
    }
    else {
      if ((bVar1 & 0xfe) != 0xde) {
        __assert_fail("c >= 0xde && c <= 0xdf",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/msgpuck.h"
                      ,0x7ea,"ptrdiff_t mp_check_map(const char *, const char *)");
      }
      lVar2 = (2L << (bVar1 & 1)) + (1 - (long)end);
    }
    return (ptrdiff_t)(cur + lVar2);
  }
  __assert_fail("mp_typeof(*cur) == MP_MAP",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/msgpuck.h",
                0x7e5,"ptrdiff_t mp_check_map(const char *, const char *)");
}

Assistant:

MP_IMPL ptrdiff_t
mp_check_map(const char *cur, const char *end)
{
	assert(cur < end);
	assert(mp_typeof(*cur) == MP_MAP);
	uint8_t c = mp_load_u8(&cur);
	if (mp_likely((c & ~0xfU) == 0x80))
		return cur - end;

	assert(c >= 0xde && c <= 0xdf); /* must be checked above by mp_typeof */
	uint32_t hsize = 2U << (c & 0x1); /* 0xde->2, 0xdf->4 */
	return hsize - (end - cur);
}